

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestStringToDoubleCommentExamples(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  undefined8 uVar6;
  bool all_used;
  int processed;
  bool local_35;
  uint local_34;
  StringToDoubleConverter local_30;
  
  dVar5 = StrToD("0x1234",1,0.0,(int *)&local_34,&local_35,0);
  if ((dVar5 != 4660.0) || (NAN(dVar5))) {
    pcVar1 = "4660.0";
    pcVar3 = "StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)";
    uVar6 = 0x40b2340000000000;
    uVar2 = 0xefa;
LAB_0084fa41:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar6,dVar5,
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,pcVar1,pcVar3);
    abort();
  }
  if (local_35 == false) {
    uVar2 = 0xefb;
    goto LAB_0084fa08;
  }
  dVar5 = StrToD("0x1234.56",1,0.0,(int *)&local_34,&local_35,0);
  if (!NAN(dVar5)) {
    pcVar1 = "Double::NaN()";
    pcVar3 = "StrToD(\"0x1234.56\", flags, 0.0, &processed, &all_used)";
    uVar6 = 0x7ff8000000000000;
    uVar2 = 0xefe;
    goto LAB_0084fa41;
  }
  if (local_34 == 0) {
    dVar5 = StrToD("0x1234.56",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 4660.0) || (NAN(dVar5))) {
      pcVar1 = "4660.0";
      pcVar3 = "StrToD(\"0x1234.56\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x40b2340000000000;
      uVar2 = 0xf03;
      goto LAB_0084fa41;
    }
    if (local_34 != 6) {
      pcVar1 = "6";
      pcVar3 = "processed";
      uVar2 = 0xf04;
      uVar4 = 6;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("01234",2,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 668.0) || (NAN(dVar5))) {
      pcVar1 = "668.0";
      pcVar3 = "StrToD(\"01234\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x4084e00000000000;
      uVar2 = 0xf07;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf08;
LAB_0084fa08:
      printf("%s:%d:\n CHECK(%s) failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar2,"all_used");
      abort();
    }
    dVar5 = StrToD("012349",2,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 12349.0) || (NAN(dVar5))) {
      pcVar1 = "12349.0";
      pcVar3 = "StrToD(\"012349\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x40c81e8000000000;
      uVar2 = 0xf0a;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf0b;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("01234.56",2,0.0,(int *)&local_34,&local_35,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\"01234.56\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf0e;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 0) {
      local_34 = 0;
      pcVar1 = "processed";
      pcVar3 = "0";
      uVar2 = 0xf0f;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("01234.56",6,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 668.0) || (NAN(dVar5))) {
      pcVar1 = "668.0";
      pcVar3 = "StrToD(\"01234.56\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x4084e00000000000;
      uVar2 = 0xf13;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 5) {
      local_34 = 5;
      pcVar1 = "processed";
      pcVar3 = "5";
      uVar2 = 0xf14;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("-   123.2",0x20,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != -123.2) || (NAN(dVar5))) {
      pcVar1 = "-123.2";
      pcVar3 = "StrToD(\"-   123.2\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0xc05ecccccccccccd;
      uVar2 = 0xf17;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf18;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("+   123.2",0x20,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 123.2) || (NAN(dVar5))) {
      pcVar1 = "123.2";
      pcVar3 = "StrToD(\"+   123.2\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x405ecccccccccccd;
      uVar2 = 0xf1b;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf1c;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("0x1234",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 4660.0) || (NAN(dVar5))) {
      pcVar1 = "4660.0";
      pcVar3 = "StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x40b2340000000000;
      uVar2 = 0xf21;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf22;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("0x1234K",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 4660.0) || (NAN(dVar5))) {
      pcVar1 = "4660.0";
      pcVar3 = "StrToD(\"0x1234K\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x40b2340000000000;
      uVar2 = 0xf24;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 6) {
      local_34 = 6;
      pcVar1 = "processed";
      pcVar3 = "6";
      uVar2 = 0xf25;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      pcVar1 = "0.0";
      pcVar3 = "StrToD(\"\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0;
      uVar2 = 0xf27;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf28;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD(" ",5,0.0,(int *)&local_34,&local_35,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\" \", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf2a;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 0) {
      local_34 = 0;
      pcVar1 = "processed";
      pcVar3 = "0";
      uVar2 = 0xf2b;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD(" 1",5,0.0,(int *)&local_34,&local_35,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\" 1\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf2d;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 0) {
      local_34 = 0;
      pcVar1 = "processed";
      pcVar3 = "0";
      uVar2 = 0xf2e;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("0x",5,0.0,(int *)&local_34,&local_35,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\"0x\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf30;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 0) {
      local_34 = 0;
      pcVar1 = "processed";
      pcVar3 = "0";
      uVar2 = 0xf31;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("-123.45",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != -123.45) || (NAN(dVar5))) {
      pcVar1 = "-123.45";
      pcVar3 = "StrToD(\"-123.45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0xc05edccccccccccd;
      uVar2 = 0xf33;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf34;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("--123.45",5,0.0,(int *)&local_34,&local_35,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\"--123.45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf37;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 0) {
      local_34 = 0;
      pcVar1 = "processed";
      pcVar3 = "0";
      uVar2 = 0xf38;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("123e45",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 1.23e+47) || (NAN(dVar5))) {
      pcVar1 = "123e45";
      pcVar3 = "StrToD(\"123e45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x49b58b82c0e0bb00;
      uVar2 = 0xf3a;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf3b;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("123E45",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 1.23e+47) || (NAN(dVar5))) {
      pcVar1 = "123e45";
      pcVar3 = "StrToD(\"123E45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x49b58b82c0e0bb00;
      uVar2 = 0xf3d;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf3e;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("123e+45",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 1.23e+47) || (NAN(dVar5))) {
      pcVar1 = "123e45";
      pcVar3 = "StrToD(\"123e+45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x49b58b82c0e0bb00;
      uVar2 = 0xf40;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf41;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("123e-45",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 1.23e-43) || (NAN(dVar5))) {
      pcVar1 = "123e-45";
      pcVar3 = "StrToD(\"123e-45\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x3705f1a59c73408e;
      uVar2 = 0xf43;
      goto LAB_0084fa41;
    }
    if (local_35 == false) {
      uVar2 = 0xf44;
      goto LAB_0084fa08;
    }
    dVar5 = StrToD("123e",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 123.0) || (NAN(dVar5))) {
      pcVar1 = "123.0";
      pcVar3 = "StrToD(\"123e\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x405ec00000000000;
      uVar2 = 0xf46;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 3) {
      local_34 = 3;
      pcVar1 = "processed";
      pcVar3 = "3";
      uVar2 = 0xf47;
      goto LAB_0084fa74;
    }
    dVar5 = StrToD("123e-",5,0.0,(int *)&local_34,&local_35,0);
    if ((dVar5 != 123.0) || (NAN(dVar5))) {
      pcVar1 = "123.0";
      pcVar3 = "StrToD(\"123e-\", flags, 0.0, &processed, &all_used)";
      uVar6 = 0x405ec00000000000;
      uVar2 = 0xf49;
      goto LAB_0084fa41;
    }
    uVar4 = (ulong)local_34;
    if (local_34 != 3) {
      local_34 = 3;
      pcVar1 = "processed";
      pcVar3 = "3";
      uVar2 = 0xf4a;
      goto LAB_0084fa74;
    }
    local_30.flags_ = 5;
    local_30.empty_string_value_ = 0.0;
    local_30.junk_string_value_ = 1.0;
    local_30.infinity_symbol_ = "infinity";
    local_30.nan_symbol_ = "NaN";
    local_30.separator_ = 0;
    dVar5 = double_conversion::StringToDoubleConverter::StringToDouble
                      (&local_30,"+NaN",4,(int *)&local_34);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "converter.StringToDouble(\"+NaN\", 4, &processed)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0xf4e;
      goto LAB_0084fa41;
    }
    if (local_34 != 4) {
      pcVar1 = "4";
      pcVar3 = "processed";
      uVar2 = 0xf4f;
      uVar4 = 4;
      goto LAB_0084fa74;
    }
    dVar5 = double_conversion::StringToDoubleConverter::StringToDouble
                      (&local_30,"-infinity",9,(int *)&local_34);
    if (-INFINITY < dVar5) {
      pcVar1 = "-Double::Infinity()";
      pcVar3 = "converter.StringToDouble(\"-infinity\", 9, &processed)";
      uVar6 = 0xfff0000000000000;
      uVar2 = 0xf52;
      goto LAB_0084fa41;
    }
    if (local_34 != 9) {
      pcVar1 = "9";
      pcVar3 = "processed";
      uVar2 = 0xf53;
      uVar4 = 9;
      goto LAB_0084fa74;
    }
    dVar5 = double_conversion::StringToDoubleConverter::StringToDouble
                      (&local_30,"Infinity",9,(int *)&local_34);
    if ((dVar5 != 1.0) || (NAN(dVar5))) {
      pcVar1 = "1.0";
      pcVar3 = "converter.StringToDouble(\"Infinity\", 9, &processed)";
      uVar6 = 0x3ff0000000000000;
      uVar2 = 0xf55;
      goto LAB_0084fa41;
    }
    if (local_34 == 0) {
      dVar5 = StrToD("0x1234",10,0.0,(int *)&local_34,&local_35,0);
      if (!NAN(dVar5)) {
        pcVar1 = "Double::NaN()";
        pcVar3 = "StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)";
        uVar6 = 0x7ff8000000000000;
        uVar2 = 0xf5c;
        goto LAB_0084fa41;
      }
      if (local_34 == 0) {
        dVar5 = StrToD("01234",10,0.0,(int *)&local_34,&local_35,0);
        if ((dVar5 != 668.0) || (NAN(dVar5))) {
          pcVar1 = "668.0";
          pcVar3 = "StrToD(\"01234\", flags, 0.0, &processed, &all_used)";
          uVar6 = 0x4084e00000000000;
          uVar2 = 0xf5f;
          goto LAB_0084fa41;
        }
        if (local_35 == false) {
          uVar2 = 0xf60;
          goto LAB_0084fa08;
        }
        dVar5 = StrToD("",10,0.0,(int *)&local_34,&local_35,0);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          pcVar1 = "0.0";
          pcVar3 = "StrToD(\"\", flags, 0.0, &processed, &all_used)";
          uVar6 = 0;
          uVar2 = 0xf62;
          goto LAB_0084fa41;
        }
        if (local_35 == false) {
          uVar2 = 0xf63;
          goto LAB_0084fa08;
        }
        dVar5 = StrToD(" ",10,0.0,(int *)&local_34,&local_35,0);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          pcVar1 = "0.0";
          pcVar3 = "StrToD(\" \", flags, 0.0, &processed, &all_used)";
          uVar6 = 0;
          uVar2 = 0xf65;
          goto LAB_0084fa41;
        }
        if (local_35 == false) {
          uVar2 = 0xf66;
          goto LAB_0084fa08;
        }
        dVar5 = StrToD(" 1",10,0.0,(int *)&local_34,&local_35,0);
        if ((dVar5 != 1.0) || (NAN(dVar5))) {
          pcVar1 = "1.0";
          pcVar3 = "StrToD(\" 1\", flags, 0.0, &processed, &all_used)";
          uVar6 = 0x3ff0000000000000;
          uVar2 = 0xf68;
          goto LAB_0084fa41;
        }
        if (local_35 == false) {
          uVar2 = 0xf69;
          goto LAB_0084fa08;
        }
        dVar5 = StrToD("0x",10,0.0,(int *)&local_34,&local_35,0);
        if (!NAN(dVar5)) {
          pcVar1 = "Double::NaN()";
          pcVar3 = "StrToD(\"0x\", flags, 0.0, &processed, &all_used)";
          uVar6 = 0x7ff8000000000000;
          uVar2 = 0xf6b;
          goto LAB_0084fa41;
        }
        if (local_34 == 0) {
          dVar5 = StrToD("0123e45",10,0.0,(int *)&local_34,&local_35,0);
          if (!NAN(dVar5)) {
            pcVar1 = "Double::NaN()";
            pcVar3 = "StrToD(\"0123e45\", flags, 0.0, &processed, &all_used)";
            uVar6 = 0x7ff8000000000000;
            uVar2 = 0xf6e;
            goto LAB_0084fa41;
          }
          if (local_34 == 0) {
            dVar5 = StrToD("01239e45",10,0.0,(int *)&local_34,&local_35,0);
            if ((dVar5 != 1.239e+48) || (NAN(dVar5))) {
              pcVar1 = "1239e45";
              pcVar3 = "StrToD(\"01239e45\", flags, 0.0, &processed, &all_used)";
              uVar6 = 0x49eb20d5cef58151;
              uVar2 = 0xf71;
              goto LAB_0084fa41;
            }
            if (local_35 == false) {
              uVar2 = 0xf72;
              goto LAB_0084fa08;
            }
            dVar5 = StrToD("-infinity",10,0.0,(int *)&local_34,&local_35,0);
            if (!NAN(dVar5)) {
              pcVar1 = "Double::NaN()";
              pcVar3 = "StrToD(\"-infinity\", flags, 0.0, &processed, &all_used)";
              uVar6 = 0x7ff8000000000000;
              uVar2 = 0xf75;
              goto LAB_0084fa41;
            }
            if (local_34 == 0) {
              dVar5 = StrToD("NaN",10,0.0,(int *)&local_34,&local_35,0);
              if (!NAN(dVar5)) {
                pcVar1 = "Double::NaN()";
                pcVar3 = "StrToD(\"NaN\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x7ff8000000000000;
                uVar2 = 0xf78;
                goto LAB_0084fa41;
              }
              if (local_34 == 0) {
                dVar5 = StrToD("1 2 3 4",0,0.0,(int *)&local_34,&local_35,0x20);
                if ((dVar5 != 1234.0) || (NAN(dVar5))) {
                  pcVar1 = "1234.0";
                  pcVar3 = "StrToD(\"1 2 3 4\", flags, 0.0, &processed, &all_used, separator)";
                  uVar6 = 0x4093480000000000;
                  uVar2 = 0xf7e;
                  goto LAB_0084fa41;
                }
                if (local_35 == false) {
                  uVar2 = 0xf7f;
                  goto LAB_0084fa08;
                }
                dVar5 = StrToD("1  2",0,0.0,(int *)&local_34,&local_35,0x20);
                if (!NAN(dVar5)) {
                  pcVar1 = "Double::NaN()";
                  pcVar3 = "StrToD(\"1  2\", flags, 0.0, &processed, &all_used, separator)";
                  uVar6 = 0x7ff8000000000000;
                  uVar2 = 0xf82;
                  goto LAB_0084fa41;
                }
                if (local_34 == 0) {
                  dVar5 = StrToD("1 000 000.0",0,0.0,(int *)&local_34,&local_35,0x20);
                  if ((dVar5 != 1000000.0) || (NAN(dVar5))) {
                    pcVar1 = "1000000.0";
                    pcVar3 = "StrToD(\"1 000 000.0\", flags, 0.0, &processed, &all_used, separator)"
                    ;
                    uVar6 = 0x412e848000000000;
                    uVar2 = 0xf86;
                    goto LAB_0084fa41;
                  }
                  if (local_35 == false) {
                    uVar2 = 0xf87;
                    goto LAB_0084fa08;
                  }
                  dVar5 = StrToD("1.000 000",0,0.0,(int *)&local_34,&local_35,0x20);
                  if ((dVar5 != 1.0) || (NAN(dVar5))) {
                    pcVar1 = "1.0";
                    pcVar3 = "StrToD(\"1.000 000\", flags, 0.0, &processed, &all_used, separator)";
                    uVar6 = 0x3ff0000000000000;
                    uVar2 = 0xf8a;
                    goto LAB_0084fa41;
                  }
                  if (local_35 == false) {
                    uVar2 = 0xf8b;
                    goto LAB_0084fa08;
                  }
                  dVar5 = StrToD("1.0e1 000",0,0.0,(int *)&local_34,&local_35,0x20);
                  if (!NAN(dVar5)) {
                    pcVar1 = "Double::NaN()";
                    pcVar3 = "StrToD(\"1.0e1 000\", flags, 0.0, &processed, &all_used, separator)";
                    uVar6 = 0x7ff8000000000000;
                    uVar2 = 0xf8e;
                    goto LAB_0084fa41;
                  }
                  if (local_34 == 0) {
                    return;
                  }
                  uVar2 = 0xf8f;
                }
                else {
                  uVar2 = 0xf83;
                }
              }
              else {
                uVar2 = 0xf79;
              }
            }
            else {
              uVar2 = 0xf76;
            }
          }
          else {
            uVar2 = 0xf6f;
          }
        }
        else {
          uVar2 = 0xf6c;
        }
      }
      else {
        uVar2 = 0xf5d;
      }
    }
    else {
      uVar2 = 0xf56;
    }
  }
  else {
    uVar2 = 0xeff;
  }
  pcVar3 = "processed";
  pcVar1 = "0";
  uVar4 = 0;
LAB_0084fa74:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,pcVar1,pcVar3,uVar4,local_34);
  abort();
}

Assistant:

TEST(StringToDoubleCommentExamples) {
  // Make sure the examples in the comments are correct.
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_HEX;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(4660.0,
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(12349.0, StrToD("012349", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(668.0,
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 5);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(-123.2, StrToD("-   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(123.2, StrToD("+   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(4660.0, StrToD("0x1234K", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 6);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(-123.45, StrToD("-123.45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("--123.45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(123e45, StrToD("123e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123E45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123e+45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e-45, StrToD("123e-45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123.0, StrToD("123e", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  {
    StringToDoubleConverter converter(flags, 0.0, 1.0, "infinity", "NaN");
    CHECK_EQ(Double::NaN(), converter.StringToDouble("+NaN", 4, &processed));
    CHECK_EQ(4, processed);

    CHECK_EQ(-Double::Infinity(),
             converter.StringToDouble("-infinity", 9, &processed));
    CHECK_EQ(9, processed);

    CHECK_EQ(1.0, converter.StringToDouble("Infinity", 9, &processed));
    CHECK_EQ(0, processed);
  }

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(Double::NaN(), StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0123e45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(1239e45, StrToD("01239e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("-infinity", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("NaN", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags = StringToDoubleConverter::NO_FLAGS;
  char separator = ' ';
  CHECK_EQ(1234.0,
           StrToD("1 2 3 4", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1  2", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(1000000.0,
           StrToD("1 000 000.0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0,
           StrToD("1.000 000", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1.0e1 000", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);
}